

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceContextVkImpl.cpp
# Opt level: O2

void __thiscall
Diligent::DeviceContextVkImpl::CopyTexture
          (DeviceContextVkImpl *this,CopyTextureAttribs *CopyAttribs)

{
  USAGE UVar1;
  USAGE UVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  VkImageAspectFlags VVar5;
  VkImageAspectFlags VVar6;
  TextureVkImpl *pTexture;
  TextureVkImpl *pTexture_00;
  Uint64 UVar7;
  TextureDesc *pTVar8;
  TEXTURE_FORMAT Format;
  Box *SrcRegion;
  MipLevelProperties MipLevelAttribs;
  Box FullMipBox;
  string msg;
  
  DeviceContextBase<Diligent::EngineVkImplTraits>::CopyTexture
            ((DeviceContextBase<Diligent::EngineVkImplTraits> *)this,CopyAttribs);
  pTexture = ClassPtrCast<Diligent::TextureVkImpl,Diligent::ITexture>(CopyAttribs->pSrcTexture);
  pTexture_00 = ClassPtrCast<Diligent::TextureVkImpl,Diligent::ITexture>(CopyAttribs->pDstTexture);
  DeviceContextBase<Diligent::EngineVkImplTraits>::UnbindTextureFromFramebuffer
            ((DeviceContextBase<Diligent::EngineVkImplTraits> *)this,pTexture,true);
  DeviceContextBase<Diligent::EngineVkImplTraits>::UnbindTextureFromFramebuffer
            ((DeviceContextBase<Diligent::EngineVkImplTraits> *)this,pTexture_00,true);
  pTVar8 = &(pTexture->super_TextureBase<Diligent::EngineVkImplTraits>).
            super_DeviceObjectBase<Diligent::ITextureVk,_Diligent::RenderDeviceVkImpl,_Diligent::TextureDesc>
            .m_Desc;
  SrcRegion = CopyAttribs->pSrcBox;
  FullMipBox.MinX = 0;
  FullMipBox.MaxX = 0;
  FullMipBox.MinY = 0;
  FullMipBox.MaxY = 0;
  FullMipBox.MinZ = 0;
  FullMipBox.MaxZ = 1;
  if (SrcRegion == (Box *)0x0) {
    GetMipLevelProperties(&MipLevelAttribs,pTVar8,CopyAttribs->SrcMipLevel);
    SrcRegion = &FullMipBox;
    FullMipBox.MaxX = MipLevelAttribs.LogicalWidth;
    FullMipBox.MaxY = MipLevelAttribs.LogicalHeight;
    FullMipBox.MaxZ = MipLevelAttribs.Depth;
  }
  UVar1 = (pTexture->super_TextureBase<Diligent::EngineVkImplTraits>).
          super_DeviceObjectBase<Diligent::ITextureVk,_Diligent::RenderDeviceVkImpl,_Diligent::TextureDesc>
          .m_Desc.Usage;
  UVar2 = (pTexture_00->super_TextureBase<Diligent::EngineVkImplTraits>).
          super_DeviceObjectBase<Diligent::ITextureVk,_Diligent::RenderDeviceVkImpl,_Diligent::TextureDesc>
          .m_Desc.Usage;
  if ((UVar1 == USAGE_STAGING) || (UVar2 == USAGE_STAGING)) {
    if ((UVar1 == USAGE_STAGING) && (UVar2 != USAGE_STAGING)) {
      if (((pTexture->super_TextureBase<Diligent::EngineVkImplTraits>).
           super_DeviceObjectBase<Diligent::ITextureVk,_Diligent::RenderDeviceVkImpl,_Diligent::TextureDesc>
           .m_Desc.CPUAccessFlags & CPU_ACCESS_FLAG_LAST) == CPU_ACCESS_NONE) {
        FormatString<char[88]>
                  ((string *)&MipLevelAttribs,
                   (char (*) [88])
                   "Attempting to copy from staging texture that was not created with CPU_ACCESS_WRITE flag"
                  );
        DebugAssertionFailed
                  ((Char *)CONCAT44(MipLevelAttribs.LogicalHeight,MipLevelAttribs.LogicalWidth),
                   "CopyTexture",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
                   ,0x968);
        std::__cxx11::string::~string((string *)&MipLevelAttribs);
      }
      if ((pTexture->super_TextureBase<Diligent::EngineVkImplTraits>).m_State !=
          RESOURCE_STATE_COPY_SOURCE) {
        FormatString<char[79]>
                  ((string *)&MipLevelAttribs,
                   (char (*) [79])
                   "Source staging texture must permanently be in RESOURCE_STATE_COPY_SOURCE state")
        ;
        DebugAssertionFailed
                  ((Char *)CONCAT44(MipLevelAttribs.LogicalHeight,MipLevelAttribs.LogicalWidth),
                   "CopyTexture",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
                   ,0x969);
        std::__cxx11::string::~string((string *)&MipLevelAttribs);
      }
      UVar7 = GetStagingTextureLocationOffset
                        (pTVar8,CopyAttribs->SrcSlice,CopyAttribs->SrcMipLevel,0x10,SrcRegion->MinX,
                         SrcRegion->MinY,SrcRegion->MinZ);
      GetMipLevelProperties(&MipLevelAttribs,pTVar8,CopyAttribs->SrcMipLevel);
      msg._M_dataplus._M_p._0_4_ = CopyAttribs->DstX;
      msg._M_string_length._0_4_ = CopyAttribs->DstY;
      msg.field_2._M_allocated_capacity._0_4_ = CopyAttribs->DstZ;
      msg._M_dataplus._M_p._4_4_ = (CopyAttribs->DstX + SrcRegion->MaxX) - SrcRegion->MinX;
      msg._M_string_length._4_4_ = (CopyAttribs->DstY + SrcRegion->MaxY) - SrcRegion->MinY;
      msg.field_2._M_allocated_capacity._4_4_ =
           (CopyAttribs->DstZ + SrcRegion->MaxZ) - SrcRegion->MinZ;
      CopyBufferToTexture(this,(pTexture->m_StagingBuffer).m_VkObject,UVar7,
                          MipLevelAttribs.StorageWidth,pTexture_00,(Box *)&msg,
                          CopyAttribs->DstMipLevel,CopyAttribs->DstSlice,
                          CopyAttribs->DstTextureTransitionMode);
    }
    else if ((UVar1 == USAGE_STAGING) || (UVar2 != USAGE_STAGING)) {
      FormatString<char[100]>
                ((string *)&MipLevelAttribs,
                 (char (*) [100])
                 "Copying data between staging textures is not supported and is likely not want you really want to do"
                );
      DebugAssertionFailed
                ((Char *)CONCAT44(MipLevelAttribs.LogicalHeight,MipLevelAttribs.LogicalWidth),
                 "CopyTexture",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
                 ,0x9a3);
      std::__cxx11::string::~string((string *)&MipLevelAttribs);
    }
    else {
      if (((pTexture_00->super_TextureBase<Diligent::EngineVkImplTraits>).
           super_DeviceObjectBase<Diligent::ITextureVk,_Diligent::RenderDeviceVkImpl,_Diligent::TextureDesc>
           .m_Desc.CPUAccessFlags & CPU_ACCESS_READ) == CPU_ACCESS_NONE) {
        FormatString<char[85]>
                  ((string *)&MipLevelAttribs,
                   (char (*) [85])
                   "Attempting to copy to staging texture that was not created with CPU_ACCESS_READ flag"
                  );
        DebugAssertionFailed
                  ((Char *)CONCAT44(MipLevelAttribs.LogicalHeight,MipLevelAttribs.LogicalWidth),
                   "CopyTexture",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
                   ,0x98c);
        std::__cxx11::string::~string((string *)&MipLevelAttribs);
      }
      if ((pTexture_00->super_TextureBase<Diligent::EngineVkImplTraits>).m_State !=
          RESOURCE_STATE_COPY_DEST) {
        FormatString<char[82]>
                  ((string *)&MipLevelAttribs,
                   (char (*) [82])
                   "Destination staging texture must permanently be in RESOURCE_STATE_COPY_DEST state"
                  );
        DebugAssertionFailed
                  ((Char *)CONCAT44(MipLevelAttribs.LogicalHeight,MipLevelAttribs.LogicalWidth),
                   "CopyTexture",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
                   ,0x98d);
        std::__cxx11::string::~string((string *)&MipLevelAttribs);
      }
      pTVar8 = &(pTexture_00->super_TextureBase<Diligent::EngineVkImplTraits>).
                super_DeviceObjectBase<Diligent::ITextureVk,_Diligent::RenderDeviceVkImpl,_Diligent::TextureDesc>
                .m_Desc;
      UVar7 = GetStagingTextureLocationOffset
                        (pTVar8,CopyAttribs->DstSlice,CopyAttribs->DstMipLevel,0x10,
                         CopyAttribs->DstX,CopyAttribs->DstY,CopyAttribs->DstZ);
      GetMipLevelProperties(&MipLevelAttribs,pTVar8,CopyAttribs->DstMipLevel);
      CopyTextureToBuffer(this,pTexture,SrcRegion,CopyAttribs->SrcMipLevel,CopyAttribs->SrcSlice,
                          CopyAttribs->SrcTextureTransitionMode,
                          (pTexture_00->m_StagingBuffer).m_VkObject,UVar7,
                          MipLevelAttribs.StorageWidth);
    }
  }
  else {
    MipLevelAttribs.Depth = SrcRegion->MinX;
    MipLevelAttribs._20_4_ = SrcRegion->MinY;
    MipLevelAttribs.RowSize._0_4_ = SrcRegion->MinZ;
    Format = (short)SrcRegion->MaxX - (short)MipLevelAttribs.Depth;
    VVar5 = CopyTexture::anon_class_1_0_00000001::operator()
                      ((anon_class_1_0_00000001 *)
                       (ulong)(pTexture->super_TextureBase<Diligent::EngineVkImplTraits>).
                              super_DeviceObjectBase<Diligent::ITextureVk,_Diligent::RenderDeviceVkImpl,_Diligent::TextureDesc>
                              .m_Desc.Format,Format);
    VVar6 = CopyTexture::anon_class_1_0_00000001::operator()
                      ((anon_class_1_0_00000001 *)
                       (ulong)(pTexture_00->super_TextureBase<Diligent::EngineVkImplTraits>).
                              super_DeviceObjectBase<Diligent::ITextureVk,_Diligent::RenderDeviceVkImpl,_Diligent::TextureDesc>
                              .m_Desc.Format,Format);
    if (VVar5 != VVar6) {
      FormatString<char[62]>
                (&msg,(char (*) [62])"Vulkan spec requires that dst and src aspect masks must match"
                );
      DebugAssertionFailed
                ((Char *)CONCAT44(msg._M_dataplus._M_p._4_4_,(Uint32)msg._M_dataplus._M_p),
                 "CopyTexture",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
                 ,0x954);
      std::__cxx11::string::~string((string *)&msg);
    }
    MipLevelAttribs.StorageHeight = 1;
    uVar3 = CopyAttribs->SrcMipLevel;
    uVar4 = CopyAttribs->SrcSlice;
    MipLevelAttribs.DepthSliceSize._0_4_ = CopyAttribs->DstMipLevel;
    MipLevelAttribs.DepthSliceSize._4_4_ = CopyAttribs->DstSlice;
    MipLevelAttribs.MipSize._4_4_ = CopyAttribs->DstX;
    unique0x00012004 = CopyAttribs->DstY;
    MipLevelAttribs.LogicalWidth = VVar5;
    MipLevelAttribs.LogicalHeight = uVar3;
    MipLevelAttribs.StorageWidth = uVar4;
    MipLevelAttribs.RowSize._4_4_ = VVar5;
    MipLevelAttribs.MipSize._0_4_ = MipLevelAttribs.StorageHeight;
    CopyTextureRegion(this,pTexture,CopyAttribs->SrcTextureTransitionMode,pTexture_00,
                      CopyAttribs->DstTextureTransitionMode,(VkImageCopy *)&MipLevelAttribs);
  }
  return;
}

Assistant:

void DeviceContextVkImpl::CopyTexture(const CopyTextureAttribs& CopyAttribs)
{
    TDeviceContextBase::CopyTexture(CopyAttribs);

    TextureVkImpl* pSrcTexVk = ClassPtrCast<TextureVkImpl>(CopyAttribs.pSrcTexture);
    TextureVkImpl* pDstTexVk = ClassPtrCast<TextureVkImpl>(CopyAttribs.pDstTexture);

    // We must unbind the textures from framebuffer because
    // we will transition their states. If we later try to commit
    // them as render targets (e.g. from SetPipelineState()), a
    // state mismatch error will occur.
    UnbindTextureFromFramebuffer(pSrcTexVk, true);
    UnbindTextureFromFramebuffer(pDstTexVk, true);

    const TextureDesc& SrcTexDesc = pSrcTexVk->GetDesc();
    const TextureDesc& DstTexDesc = pDstTexVk->GetDesc();
    const Box*         pSrcBox    = CopyAttribs.pSrcBox;
    Box                FullMipBox;
    if (pSrcBox == nullptr)
    {
        MipLevelProperties MipLevelAttribs = GetMipLevelProperties(SrcTexDesc, CopyAttribs.SrcMipLevel);

        FullMipBox.MaxX = MipLevelAttribs.LogicalWidth;
        FullMipBox.MaxY = MipLevelAttribs.LogicalHeight;
        FullMipBox.MaxZ = MipLevelAttribs.Depth;
        pSrcBox         = &FullMipBox;
    }

    if (SrcTexDesc.Usage != USAGE_STAGING && DstTexDesc.Usage != USAGE_STAGING)
    {
        VkImageCopy CopyRegion = {};

        CopyRegion.srcOffset.x   = pSrcBox->MinX;
        CopyRegion.srcOffset.y   = pSrcBox->MinY;
        CopyRegion.srcOffset.z   = pSrcBox->MinZ;
        CopyRegion.extent.width  = pSrcBox->Width();
        CopyRegion.extent.height = std::max(pSrcBox->Height(), 1u);
        CopyRegion.extent.depth  = std::max(pSrcBox->Depth(), 1u);

        auto GetAspectMak = [](TEXTURE_FORMAT Format) -> VkImageAspectFlags {
            const TextureFormatAttribs& FmtAttribs = GetTextureFormatAttribs(Format);
            return ComponentTypeToVkAspectMask(FmtAttribs.ComponentType);
        };
        VkImageAspectFlags aspectMask = GetAspectMak(SrcTexDesc.Format);
        DEV_CHECK_ERR(aspectMask == GetAspectMak(DstTexDesc.Format), "Vulkan spec requires that dst and src aspect masks must match");

        CopyRegion.srcSubresource.baseArrayLayer = CopyAttribs.SrcSlice;
        CopyRegion.srcSubresource.layerCount     = 1;
        CopyRegion.srcSubresource.mipLevel       = CopyAttribs.SrcMipLevel;
        CopyRegion.srcSubresource.aspectMask     = aspectMask;

        CopyRegion.dstSubresource.baseArrayLayer = CopyAttribs.DstSlice;
        CopyRegion.dstSubresource.layerCount     = 1;
        CopyRegion.dstSubresource.mipLevel       = CopyAttribs.DstMipLevel;
        CopyRegion.dstSubresource.aspectMask     = aspectMask;

        CopyRegion.dstOffset.x = CopyAttribs.DstX;
        CopyRegion.dstOffset.y = CopyAttribs.DstY;
        CopyRegion.dstOffset.z = CopyAttribs.DstZ;

        CopyTextureRegion(pSrcTexVk, CopyAttribs.SrcTextureTransitionMode, pDstTexVk, CopyAttribs.DstTextureTransitionMode, CopyRegion);
    }
    else if (SrcTexDesc.Usage == USAGE_STAGING && DstTexDesc.Usage != USAGE_STAGING)
    {
        DEV_CHECK_ERR((SrcTexDesc.CPUAccessFlags & CPU_ACCESS_WRITE), "Attempting to copy from staging texture that was not created with CPU_ACCESS_WRITE flag");
        DEV_CHECK_ERR(pSrcTexVk->GetState() == RESOURCE_STATE_COPY_SOURCE, "Source staging texture must permanently be in RESOURCE_STATE_COPY_SOURCE state");

        // address of (x,y,z) = region->bufferOffset + (((z * imageHeight) + y) * rowLength + x) * texelBlockSize; (18.4.1)

        // bufferOffset must be a multiple of 4 (18.4)
        // If the calling command's VkImage parameter is a compressed image, bufferOffset
        // must be a multiple of the compressed texel block size in bytes (18.4). This
        // is automatically guaranteed as MipWidth and MipHeight are rounded to block size.

        const Uint64 SrcBufferOffset =
            GetStagingTextureLocationOffset(SrcTexDesc, CopyAttribs.SrcSlice, CopyAttribs.SrcMipLevel,
                                            TextureVkImpl::StagingBufferOffsetAlignment,
                                            pSrcBox->MinX, pSrcBox->MinY, pSrcBox->MinZ);
        const MipLevelProperties SrcMipLevelAttribs = GetMipLevelProperties(SrcTexDesc, CopyAttribs.SrcMipLevel);

        Box DstBox;
        DstBox.MinX = CopyAttribs.DstX;
        DstBox.MinY = CopyAttribs.DstY;
        DstBox.MinZ = CopyAttribs.DstZ;
        DstBox.MaxX = DstBox.MinX + pSrcBox->Width();
        DstBox.MaxY = DstBox.MinY + pSrcBox->Height();
        DstBox.MaxZ = DstBox.MinZ + pSrcBox->Depth();

        CopyBufferToTexture(
            pSrcTexVk->GetVkStagingBuffer(),
            SrcBufferOffset,
            SrcMipLevelAttribs.StorageWidth, // GetStagingTextureLocationOffset assumes texels are tightly packed
            *pDstTexVk,
            DstBox,
            CopyAttribs.DstMipLevel,
            CopyAttribs.DstSlice,
            CopyAttribs.DstTextureTransitionMode);
    }
    else if (SrcTexDesc.Usage != USAGE_STAGING && DstTexDesc.Usage == USAGE_STAGING)
    {
        DEV_CHECK_ERR((DstTexDesc.CPUAccessFlags & CPU_ACCESS_READ), "Attempting to copy to staging texture that was not created with CPU_ACCESS_READ flag");
        DEV_CHECK_ERR(pDstTexVk->GetState() == RESOURCE_STATE_COPY_DEST, "Destination staging texture must permanently be in RESOURCE_STATE_COPY_DEST state");

        // address of (x,y,z) = region->bufferOffset + (((z * imageHeight) + y) * rowLength + x) * texelBlockSize; (18.4.1)
        const Uint64 DstBufferOffset =
            GetStagingTextureLocationOffset(DstTexDesc, CopyAttribs.DstSlice, CopyAttribs.DstMipLevel,
                                            TextureVkImpl::StagingBufferOffsetAlignment,
                                            CopyAttribs.DstX, CopyAttribs.DstY, CopyAttribs.DstZ);
        const MipLevelProperties DstMipLevelAttribs = GetMipLevelProperties(DstTexDesc, CopyAttribs.DstMipLevel);

        CopyTextureToBuffer(
            *pSrcTexVk,
            *pSrcBox,
            CopyAttribs.SrcMipLevel,
            CopyAttribs.SrcSlice,
            CopyAttribs.SrcTextureTransitionMode,
            pDstTexVk->GetVkStagingBuffer(),
            DstBufferOffset,
            DstMipLevelAttribs.StorageWidth // GetStagingTextureLocationOffset assumes texels are tightly packed
        );
    }
    else
    {
        UNSUPPORTED("Copying data between staging textures is not supported and is likely not want you really want to do");
    }
}